

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store(XMLWriter *this,DistantLight *light,ssize_t id)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  vfloat4 a;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"DistantLight","");
  open(this,(char *)local_88,(int)id);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  fVar4 = (light->D).field_0.m128[0];
  fVar5 = (light->D).field_0.m128[2];
  fVar3 = -(light->D).field_0.m128[1];
  fVar8 = -fVar5;
  auVar6._8_4_ = 0xffffffff;
  auVar6._0_8_ = 0xffffffffffffffff;
  if (fVar3 * fVar3 + fVar5 * fVar5 + 0.0 <= fVar4 * fVar4 + fVar8 * fVar8 + 0.0) {
    auVar6 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar7._0_4_ = ~auVar6._0_4_ & (uint)fVar8;
  auVar7._4_4_ = 0;
  auVar7._8_4_ = ~auVar6._8_4_ & (uint)fVar4;
  auVar2._4_4_ = (uint)fVar3 & auVar6._8_4_;
  auVar2._0_4_ = (uint)fVar5 & auVar6._4_4_;
  auVar2._8_4_ = 0;
  auVar7 = auVar7 | auVar2 << 0x20;
  fVar3 = auVar7._0_4_;
  fVar8 = auVar7._4_4_;
  fVar14 = auVar7._8_4_;
  fVar4 = fVar8 * fVar8;
  fVar5 = fVar14 * fVar14;
  fVar10 = fVar4 + fVar3 * fVar3 + fVar5;
  fVar11 = fVar4 + fVar4 + 0.0;
  fVar5 = fVar4 + fVar5 + fVar5;
  fVar4 = fVar4 + 0.0 + 0.0;
  auVar12._4_4_ = fVar11;
  auVar12._0_4_ = fVar10;
  auVar12._8_4_ = fVar5;
  auVar12._12_4_ = fVar4;
  auVar13._4_4_ = fVar11;
  auVar13._0_4_ = fVar10;
  auVar13._8_4_ = fVar5;
  auVar13._12_4_ = fVar4;
  auVar13 = rsqrtss(auVar12,auVar13);
  fVar4 = auVar13._0_4_;
  fVar4 = fVar4 * 1.5 - fVar4 * fVar4 * fVar10 * 0.5 * fVar4;
  local_68.m128[0] = fVar4 * fVar3;
  local_68.m128[1] = fVar4 * fVar8;
  local_68.m128[2] = fVar4 * fVar14;
  local_68.m128[3] = fVar4 * 0.0;
  local_48 = (light->D).field_0.m128[0];
  fStack_44 = (light->D).field_0.m128[1];
  fStack_40 = (light->D).field_0.m128[2];
  fStack_3c = (light->D).field_0.m128[3];
  fStack_50 = local_68.m128[1] * local_48 - fStack_44 * local_68.m128[0];
  local_58 = local_68.m128[2] * fStack_44 - fStack_40 * local_68.m128[1];
  fStack_54 = local_68.m128[0] * fStack_40 - local_48 * local_68.m128[2];
  fVar3 = local_68.m128[3] * fStack_3c - fStack_3c * local_68.m128[3];
  fVar4 = local_58 * local_58;
  fVar5 = fStack_54 * fStack_54;
  fVar8 = fVar3 * fVar3;
  fVar14 = fVar5 + fVar4 + fStack_50 * fStack_50;
  fVar10 = fVar8 + fVar4 + fVar4;
  fVar5 = fVar5 + fVar4 + fVar5;
  fVar8 = fVar8 + fVar4 + fVar8;
  auVar9._4_4_ = fVar10;
  auVar9._0_4_ = fVar14;
  auVar9._8_4_ = fVar5;
  auVar9._12_4_ = fVar8;
  auVar1._4_4_ = fVar10;
  auVar1._0_4_ = fVar14;
  auVar1._8_4_ = fVar5;
  auVar1._12_4_ = fVar8;
  auVar13 = rsqrtss(auVar9,auVar1);
  fVar4 = auVar13._0_4_;
  fStack_4c = fVar4 * 1.5 - fVar4 * fVar4 * fVar14 * 0.5 * fVar4;
  local_58 = fStack_4c * local_58;
  fStack_54 = fStack_4c * fStack_54;
  fStack_50 = fStack_4c * fStack_50;
  fStack_4c = fStack_4c * fVar3;
  local_38 = 0;
  uStack_30 = 0;
  store(this,"AffineSpace",(AffineSpace3fa *)&local_68.field_1);
  store(this,"L",&light->L);
  store(this,"halfAngle",&light->halfAngle);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"DistantLight","");
  close(this,(int)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::DistantLight& light, ssize_t id)
  {
    open("DistantLight",id);
    store("AffineSpace",frame(light.D));
    store("L",light.L);
    store("halfAngle",light.halfAngle);
    close("DistantLight");
  }